

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LParser.cpp
# Opt level: O1

shared_ptr<LNode> __thiscall LParser::shift_DO(LParser *this)

{
  element_type *peVar1;
  LParser *in_RSI;
  shared_ptr<LNode> sVar2;
  
  move(in_RSI);
  (this->lexer)._M_t.super___uniq_ptr_impl<LLexer,_std::default_delete<LLexer>_>._M_t.
  super__Tuple_impl<0UL,_LLexer_*,_std::default_delete<LLexer>_>.
  super__Head_base<0UL,_LLexer_*,_false>._M_head_impl = (LLexer *)0x0;
  peVar1 = (element_type *)operator_new(0x20);
  (peVar1->token)._M_dataplus._M_p = (pointer)0x100000001;
  *(undefined ***)peVar1 = &PTR___Sp_counted_ptr_inplace_00122818;
  (peVar1->token)._M_string_length = (size_type)&PTR__LNode_00122770;
  *(undefined4 *)&(peVar1->token).field_2 = 6;
  (this->peek).super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (this->lexer)._M_t.super___uniq_ptr_impl<LLexer,_std::default_delete<LLexer>_>._M_t.
  super__Tuple_impl<0UL,_LLexer_*,_std::default_delete<LLexer>_>.
  super__Head_base<0UL,_LLexer_*,_false>._M_head_impl = (LLexer *)&(peVar1->token)._M_string_length;
  sVar2.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__LNode_00122770;
  sVar2.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<LNode>)sVar2.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<LNode> LParser::shift_DO() {
    this->move();
    return std::make_shared<LNode>(LNodeType::DO);
}